

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

void __thiscall
testing::internal::ExpectationBase::DescribeLocationTo(ExpectationBase *this,ostream *os)

{
  ostream *poVar1;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  testing::internal::FormatFileLocation_abi_cxx11_((char *)&local_30,(int)this->file_);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_30,local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return;
}

Assistant:

void DescribeLocationTo(::std::ostream* os) const {
    *os << FormatFileLocation(file(), line()) << " ";
  }